

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

CaseInvariantPropertyListWithHashCode ** __thiscall
JsUtil::
BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::LookupWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  bool bVar2;
  hash_t hVar3;
  uint uVar4;
  CaseInvariantPropertyListWithHashCode **ppCVar5;
  DictionaryStats *this_00;
  uint uVar6;
  
  lVar1 = *(long *)this;
  uVar4 = 0;
  if (lVar1 != 0) {
    hVar3 = NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::GetHashCode(key);
    uVar4 = BaseDictionary<Js::CaseInvariantPropertyListWithHashCode_*,_Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(hVar3 * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar6 = *(uint *)(lVar1 + (ulong)uVar4 * 4);
    uVar4 = 0;
    if (-1 < (int)uVar6) {
      lVar1 = *(long *)(this + 8);
      uVar4 = 0;
      do {
        bVar2 = NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::Equals
                          (*(CaseInvariantPropertyListWithHashCode **)
                            (lVar1 + 0x10 + (ulong)uVar6 * 0x18),key);
        if (bVar2) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_007c408e;
        }
        uVar4 = uVar4 + 1;
        uVar6 = *(uint *)((ulong)uVar6 * 0x18 + lVar1 + 8);
      } while (-1 < (int)uVar6);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar6 = 0xffffffff;
LAB_007c408e:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  if ((int)uVar6 < 0) {
    ppCVar5 = &BaseHashSet<Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::CaseInvariantPropertyListWithHashCode_*,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::LookupWithKey<JsUtil::CharacterBuffer<char16_t>_>::nullElement;
  }
  else {
    ppCVar5 = (CaseInvariantPropertyListWithHashCode **)((ulong)uVar6 * 0x18 + *(long *)(this + 8));
  }
  return ppCVar5;
}

Assistant:

TElement const& LookupWithKey(KeyType const& key)
        {
            static const TElement nullElement = nullptr;

            return __super::LookupWithKey(key, nullElement);
        }